

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O3

bool __thiscall
Merge::collectCorrectable
          (Merge *this,vector<Varnode_*,_std::allocator<Varnode_*>_> *vlist,
          list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *oplist,
          vector<int,_std::allocator<int>_> *slotlist,PcodeOp *op)

{
  size_t *psVar1;
  int4 i;
  Varnode *this_00;
  PcodeOp *op_00;
  pointer ppVVar2;
  iterator __position;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *plVar3;
  _List_node_base *p_Var4;
  uintm uVar5;
  int4 iVar6;
  uintm uVar7;
  CoverBlock *this_01;
  _List_node_base *p_Var8;
  ulong uVar9;
  _List_node_base *p_Var10;
  int4 slot;
  uint local_5c;
  _List_node_base *local_58;
  vector<Varnode_*,_std::allocator<Varnode_*>_> *local_50;
  PcodeOp *local_48;
  pointer local_40;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *local_38;
  
  i = (op->parent->super_FlowBlock).index;
  local_48 = op;
  local_38 = oplist;
  uVar5 = CoverBlock::getUIndex(op);
  local_40 = (vlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = vlist;
  if (local_40 !=
      (vlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *local_40;
      Varnode::updateCover(this_00);
      this_01 = Cover::getCoverBlock(this_00->cover,i);
      iVar6 = CoverBlock::boundary(this_01,local_48);
      if (iVar6 != 2) {
        if (iVar6 == 0) {
          return false;
        }
        p_Var8 = (_List_node_base *)&this_00->descend;
        p_Var10 = (this_00->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl
                  ._M_node.super__List_node_base._M_next;
        p_Var4 = p_Var8;
        if (p_Var10 != p_Var8) {
          do {
            local_58 = p_Var4;
            op_00 = (PcodeOp *)p_Var10[1]._M_next;
            uVar7 = CoverBlock::getUIndex(op_00);
            if (uVar7 == uVar5) {
              p_Var8 = (_List_node_base *)operator_new(0x18);
              plVar3 = local_38;
              p_Var8[1]._M_next = (_List_node_base *)op_00;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              p_Var8 = local_58;
              psVar1 = &(plVar3->super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>)._M_impl.
                        _M_node._M_size;
              *psVar1 = *psVar1 + 1;
              ppVVar2 = (op_00->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_5c = (uint)((ulong)((long)(op_00->inrefs).
                                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppVVar2) >> 3);
              if ((int)local_5c < 1) {
                local_5c = 0;
              }
              else {
                uVar9 = 0;
                do {
                  if (ppVVar2[uVar9] == this_00) {
                    local_5c = (uint)uVar9;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while ((local_5c & 0x7fffffff) != uVar9);
              }
              __position._M_current =
                   (slotlist->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (slotlist->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)slotlist,__position,(int *)&local_5c);
              }
              else {
                *__position._M_current = local_5c;
                (slotlist->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
            }
            p_Var10 = p_Var10->_M_next;
            p_Var4 = local_58;
          } while (p_Var10 != p_Var8);
        }
      }
      local_40 = local_40 + 1;
    } while (local_40 !=
             (local_50->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return true;
}

Assistant:

bool Merge::collectCorrectable(const vector<Varnode *> &vlist,list<PcodeOp *> &oplist,
			       vector<int4> &slotlist,PcodeOp *op)
{
  int4 blk = op->getParent()->getIndex();
  vector<Varnode *>::const_iterator viter;
  list<PcodeOp *>::const_iterator oiter;
  Varnode *vn;
  PcodeOp *edgeop;
  int4 slot,bound;
  uintm opuindex = CoverBlock::getUIndex(op);

  for(viter=vlist.begin();viter!=vlist.end();++viter) {
    vn = *viter;
    bound = vn->getCover()->getCoverBlock(blk).boundary(op);
    if (bound == 0) return false;
    if (bound == 2) continue;	// Not defined before op (intersects with write op)
    for(oiter=vn->beginDescend();oiter!=vn->endDescend();++oiter) {
      edgeop = *oiter;
      if (CoverBlock::getUIndex(edgeop) == opuindex) { // Correctable
	oplist.push_back(edgeop);
	slot = edgeop->getSlot(vn);
	slotlist.push_back(slot);
      }
    }
  }
  return true;
}